

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseShaderInputConnectionProperty
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedConnection<tinyusdz::Token> *target)

{
  Type TVar1;
  bool bVar2;
  ParseResult *pPVar3;
  const_iterator cVar4;
  ParseResult *extraout_RAX;
  ParseResult *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  (__return_storage_ptr__->err)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->err).field_2;
  (__return_storage_ptr__->err)._M_string_length = 0;
  (__return_storage_ptr__->err).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->code = InternalError;
  pPVar3 = (ParseResult *)::std::__cxx11::string::compare((string *)prop_name);
  if ((int)pPVar3 != 0) {
    __return_storage_ptr__->code = Unmatched;
    return pPVar3;
  }
  cVar4 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)table,name);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(table->_M_t)._M_impl.super__Rb_tree_header;
  if (cVar4._M_node == (_Base_ptr)args) {
    TVar1 = prop->_type;
    if ((TVar1 != NoTargetsRelation) && (TVar1 != EmptyAttrib)) {
      if ((Attrib < TVar1) || (bVar2 = Attribute::is_connection(&prop->_attrib), !bVar2)) {
        __return_storage_ptr__->code = InternalError;
        local_70[0] = local_60;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"Property `{}` must be Attribute connection.","");
        fmt::format<std::__cxx11::string>(&local_50,(fmt *)local_70,(string *)prop_name,args);
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->err,(string *)&local_50);
        pPVar3 = (ParseResult *)&local_50.field_2;
        if ((ParseResult *)local_50._M_dataplus._M_p != pPVar3) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          pPVar3 = extraout_RAX;
        }
        if (local_70[0] == local_60) {
          return pPVar3;
        }
        operator_delete(local_70[0],local_60[0] + 1);
        return extraout_RAX_00;
      }
      bVar2 = Attribute::is_connection(&prop->_attrib);
      if (!bVar2) {
        __return_storage_ptr__->code = InternalError;
        pPVar3 = (ParseResult *)
                 ::std::__cxx11::string::operator=
                           ((string *)&__return_storage_ptr__->err,
                            "Property is invalid Attribute connection.");
        return pPVar3;
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&target->_targetPaths,&(prop->_attrib)._paths);
    }
    target->_authored = true;
    AttrMetas::operator=(&target->_metas,&(prop->_attrib)._metas);
    pVar5 = ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)table,prop_name);
    __return_storage_ptr__->code = Success;
    return (ParseResult *)pVar5.first._M_node._M_node;
  }
  __return_storage_ptr__->code = AlreadyProcessed;
  return (ParseResult *)cVar4._M_node;
}

Assistant:

static ParseResult ParseShaderInputConnectionProperty(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedConnection<value::token> &target) /* out */
{
  ParseResult ret;
  ret.code = ParseResult::ResultCode::InternalError;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (auto pv = prop.get_relationTarget()) {
      TypedConnection<value::token> conn;
      conn.set(pv.value());
      conn.metas() = prop.get_attribute().metas();
      target = conn;
      table.insert(propname);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Property does not contain connectionPath.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    DCOUT("is_attribute = " << prop.is_attribute());
    DCOUT("is_attribute_connection = " << prop.is_attribute_connection());

    // allow empty value
    if (prop.is_empty()) {
      target.set_empty();
      target.metas() = prop.get_attribute().metas();
      table.insert(prop_name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.is_attribute_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set(attr.connections());
        target.metas() = prop.get_attribute().metas();

        table.insert(prop_name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Property is invalid Attribute connection.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = fmt::format("Property `{}` must be Attribute connection.", prop_name);
      return ret;
    }
  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}

// Rel with single targetPath(or empty)
#define PARSE_SINGLE_TARGET_PATH_RELATION(__table, __prop, __propname, __target) \
  if (prop.first == __propname) { \
    if (__table.count(__propname)) { \
       continue; \
    } \
    if (!prop.second.is_relationship()) { \
      PUSH_ERROR_AND_RETURN(fmt::format("Property `{}` must be a Relationship.", __propname)); \
    } \
    const Relationship &rel = prop.second.get_relationship(); \
    if (rel.is_path()) { \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added rel " << __propname); \
      continue; \
    } else if (rel.is_pathvector()) { \
      if (rel.targetPathVector.size() == 1) { \
        __target = rel; \
        table.insert(prop.first); \
        DCOUT("Added rel " << __propname); \
        continue; \
      } \
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` target is empty or has mutiple Paths. Must be single Path.", __propname)); \
    } else if (!rel.has_value()) { \
      /* define-only. accept  */ \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added rel " << __propname); \
    }